

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

void feel_cockatrice(obj *otmp,boolean force_touch)

{
  boolean bVar1;
  char *pcVar2;
  char *pcVar3;
  char local_218 [8];
  char kbuf [256];
  char premsg [256];
  boolean force_touch_local;
  obj *otmp_local;
  
  bVar1 = will_feel_cockatrice(otmp,force_touch);
  if (bVar1 != '\0') {
    memset(kbuf + 0xf8,0,0x100);
    memset(local_218,0,0x100);
    pcVar2 = mons_mname(mons + otmp->corpsenm);
    pcVar3 = body_part(6);
    pcVar3 = makeplural(pcVar3);
    pline("You touch the %s corpse with your bare %s.",pcVar2,pcVar3);
    bVar1 = poly_when_stoned(youmonst.data);
    if (bVar1 == '\0') {
      pcVar2 = mons_mname(mons + otmp->corpsenm);
      sprintf(kbuf + 0xf8,"Touching the %s corpse is a fatal mistake...",pcVar2);
    }
    pcVar2 = mons_mname(mons + otmp->corpsenm);
    pcVar2 = an(pcVar2);
    sprintf(local_218,"%s corpse",pcVar2);
    delayed_petrify(kbuf + 0xf8,local_218);
  }
  return;
}

Assistant:

void feel_cockatrice(struct obj *otmp, boolean force_touch)
{
	if (will_feel_cockatrice(otmp, force_touch)) {
	    char premsg[BUFSZ] = "";
	    char kbuf[BUFSZ] = "";
	    pline("You touch the %s corpse with your bare %s.",
		  mons_mname(&mons[otmp->corpsenm]), makeplural(body_part(HAND)));
	    if (!poly_when_stoned(youmonst.data)) {
		sprintf(premsg, "Touching the %s corpse is a fatal mistake...",
			mons_mname(&mons[otmp->corpsenm]));
	    }
	    sprintf(kbuf, "%s corpse", an(mons_mname(&mons[otmp->corpsenm])));
	    delayed_petrify(premsg, kbuf);
	}
}